

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cpp
# Opt level: O0

string * __thiscall
Centaurus::readmbsfromfile_abi_cxx11_(string *__return_storage_ptr__,Centaurus *this,char *filename)

{
  istreambuf_iterator<char,_std::char_traits<char>_> __beg;
  istreambuf_iterator<char,_std::char_traits<char>_> __end;
  allocator<char> local_241;
  undefined1 local_240 [12];
  undefined1 local_230 [12];
  istream_type local_220 [8];
  ifstream ifs;
  char *filename_local;
  
  std::ifstream::ifstream(local_220,(char *)this,_S_in);
  std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
            ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_230,local_220);
  std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
            ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_240);
  std::allocator<char>::allocator();
  __beg._12_4_ = 0;
  __beg._M_sbuf = (streambuf_type *)local_230._0_8_;
  __beg._M_c = local_230._8_4_;
  __end._12_4_ = 0;
  __end._M_sbuf = (streambuf_type *)local_240._0_8_;
  __end._M_c = local_240._8_4_;
  std::__cxx11::string::string<std::istreambuf_iterator<char,std::char_traits<char>>,void>
            ((string *)__return_storage_ptr__,__beg,__end,&local_241);
  std::allocator<char>::~allocator(&local_241);
  std::ifstream::~ifstream(local_220);
  return __return_storage_ptr__;
}

Assistant:

std::string readmbsfromfile(const char *filename)
{
	std::ifstream ifs(filename);

	return std::string(std::istreambuf_iterator<char>(ifs), {});
}